

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

size_t __thiscall llvm::cl::basic_parser_impl::getOptionWidth(basic_parser_impl *this,Option *O)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  size_t extraout_RDX;
  StringRef SVar3;
  size_t local_58;
  long local_50;
  size_t FormattingLen;
  StringRef ValName;
  size_t Len;
  Option *O_local;
  basic_parser_impl *this_local;
  
  ValName.Length = (O->ArgStr).Length;
  iVar1 = (**this->_vptr_basic_parser_impl)();
  SVar3.Data._4_4_ = extraout_var;
  SVar3.Data._0_4_ = iVar1;
  if (extraout_RDX != 0) {
    local_50 = 3;
    uVar2 = Option::getMiscFlags(O);
    if ((uVar2 & 2) != 0) {
      local_50 = 6;
    }
    SVar3.Length = extraout_RDX;
    SVar3 = getValueStr(O,SVar3);
    local_58 = SVar3.Length;
    ValName.Length = local_58 + local_50 + ValName.Length;
  }
  return ValName.Length + 6;
}

Assistant:

size_t basic_parser_impl::getOptionWidth(const Option &O) const {
  size_t Len = O.ArgStr.size();
  auto ValName = getValueName();
  if (!ValName.empty()) {
    size_t FormattingLen = 3;
    if (O.getMiscFlags() & PositionalEatsArgs)
      FormattingLen = 6;
    Len += getValueStr(O, ValName).size() + FormattingLen;
  }

  return Len + 6;
}